

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
::select_variables(solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  longdouble lVar1;
  int iVar2;
  longdouble lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  
  iVar2 = sizes->c_size;
  iVar5 = iVar2 + bkmin;
  if (bkmin == bkmax) {
    iVar4 = iVar5;
    if (sizes->r_size < iVar5) {
      iVar4 = sizes->r_size;
    }
  }
  else {
    iVar4 = bkmax + iVar2;
    if (sizes->r_size < bkmax + iVar2) {
      iVar4 = sizes->r_size;
    }
    if (iVar5 <= iVar4) {
      bVar7 = false;
      lVar8 = ((long)iVar2 + (long)bkmin) * 0x20;
      lVar6 = (long)iVar2 + (long)bkmin;
      do {
        lVar1 = *(longdouble *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar8);
        lVar3 = (longdouble)0;
        bVar10 = lVar1 == lVar3;
        bVar9 = lVar1 < lVar3;
        if ((bVar10) && (!NAN(lVar1) && !NAN(lVar3))) {
          dVar11 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (this->rng);
          bVar10 = dVar11 == 0.5;
          bVar9 = 0.5 < dVar11;
        }
        if (!bVar9 && !bVar10) {
          if (!bVar7) {
            iVar4 = iVar5;
          }
          break;
        }
        bVar7 = iVar4 <= lVar6;
        iVar5 = iVar5 + 1;
        lVar8 = lVar8 + 0x20;
        lVar6 = lVar6 + 1;
      } while (iVar4 + 1 != iVar5);
    }
  }
  return iVar4 + -1;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }